

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# t_swift_generator.cc
# Opt level: O0

string * __thiscall
t_swift_generator::declare_property_abi_cxx11_
          (string *__return_storage_ptr__,t_swift_generator *this,t_field *tfield,bool is_private)

{
  bool bVar1;
  ostream *poVar2;
  string *identifier;
  t_type *ptVar3;
  char *pcVar4;
  char *local_278;
  string local_258;
  string local_238;
  string local_218;
  string local_1f8;
  undefined1 local_1d8 [8];
  ostringstream render;
  allocator local_49;
  string local_48 [8];
  string visibility;
  bool is_private_local;
  t_field *tfield_local;
  t_swift_generator *this_local;
  
  if (is_private) {
    local_278 = "fileprivate";
    if ((this->gen_cocoa_ & 1U) != 0) {
      local_278 = "private";
    }
  }
  else {
    local_278 = "public";
  }
  visibility.field_2._M_local_buf[0xf] = is_private;
  std::allocator<char>::allocator();
  std::__cxx11::string::string(local_48,local_278,&local_49);
  std::allocator<char>::~allocator((allocator<char> *)&local_49);
  std::__cxx11::ostringstream::ostringstream((ostringstream *)local_1d8);
  poVar2 = std::operator<<((ostream *)local_1d8,local_48);
  poVar2 = std::operator<<(poVar2," var ");
  identifier = t_field::get_name_abi_cxx11_(tfield);
  maybe_escape_identifier(&local_1f8,this,identifier);
  std::operator<<(poVar2,(string *)&local_1f8);
  std::__cxx11::string::~string((string *)&local_1f8);
  bVar1 = field_is_optional(this,tfield);
  if (bVar1) {
    pcVar4 = "";
    if ((this->gen_cocoa_ & 1U) != 0) {
      pcVar4 = " ";
    }
    poVar2 = std::operator<<((ostream *)local_1d8,pcVar4);
    poVar2 = std::operator<<(poVar2,": ");
    ptVar3 = t_field::get_type(tfield);
    type_name_abi_cxx11_(&local_218,this,ptVar3,true,false);
    std::operator<<(poVar2,(string *)&local_218);
    std::__cxx11::string::~string((string *)&local_218);
  }
  else if ((this->gen_cocoa_ & 1U) == 0) {
    poVar2 = std::operator<<((ostream *)local_1d8,": ");
    ptVar3 = t_field::get_type(tfield);
    type_name_abi_cxx11_(&local_238,this,ptVar3,false,false);
    std::operator<<(poVar2,(string *)&local_238);
    std::__cxx11::string::~string((string *)&local_238);
  }
  else {
    poVar2 = std::operator<<((ostream *)local_1d8," = ");
    ptVar3 = t_field::get_type(tfield);
    type_name_abi_cxx11_(&local_258,this,ptVar3,false,false);
    poVar2 = std::operator<<(poVar2,(string *)&local_258);
    std::operator<<(poVar2,"()");
    std::__cxx11::string::~string((string *)&local_258);
  }
  std::__cxx11::ostringstream::str();
  std::__cxx11::ostringstream::~ostringstream((ostringstream *)local_1d8);
  std::__cxx11::string::~string(local_48);
  return __return_storage_ptr__;
}

Assistant:

string t_swift_generator::declare_property(t_field* tfield, bool is_private) {

  string visibility = is_private ? (gen_cocoa_ ? "private" : "fileprivate") : "public";

  ostringstream render;

  render << visibility << " var " << maybe_escape_identifier(tfield->get_name());

  if (field_is_optional(tfield)) {
    render << (gen_cocoa_ ? " " : "") << ": " << type_name(tfield->get_type(), true);
  }
  else {
    if (!gen_cocoa_) {
      render << ": " << type_name(tfield->get_type(), false);
    } else {
      // Swift2/Cocoa backward compat, Bad, default init
      render << " = " << type_name(tfield->get_type(), false) << "()";
    }
  }

  return render.str();
}